

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* dot<double>(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *__return_storage_ptr__,
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *matrix1,vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *matrix2)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  allocator_type local_72;
  allocator_type local_71 [9];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_68;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_60;
  value_type_conflict2 local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  pvVar1 = (matrix1->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pvVar2 = (matrix1->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (matrix2->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_50 = 0.0;
  local_60 = matrix2;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_48,
             (long)*(pointer *)
                    ((long)&(pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data + 8) -
             *(long *)&(pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data >> 3,&local_50,local_71);
  local_68 = __return_storage_ptr__;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,((long)pvVar1 - (long)pvVar2 >> 3) * -0x5555555555555555,&local_48
           ,&local_72);
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  pvVar1 = (matrix1->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar11 = (long)(matrix1->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
  if (lVar11 != 0) {
    lVar11 = (lVar11 >> 3) * -0x5555555555555555;
    pdVar4 = (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = *(pointer *)
              ((long)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data + 8);
    lVar14 = (long)pdVar5 - (long)pdVar4 >> 3;
    lVar15 = 0;
    do {
      if (pdVar5 != pdVar4) {
        pvVar2 = (local_60->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pdVar6 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7 = *(pointer *)
                  ((long)&(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data + 8);
        lVar16 = (long)pdVar7 - (long)pdVar6 >> 3;
        pvVar3 = (local_68->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar13 = 0;
        do {
          if (pdVar7 != pdVar6) {
            lVar8 = *(long *)&pvVar1[lVar15].super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl;
            lVar9 = *(long *)&pvVar2[lVar13].super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl;
            lVar10 = *(long *)&pvVar3[lVar15].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data;
            lVar12 = 0;
            do {
              *(double *)(lVar10 + lVar12 * 8) =
                   *(double *)(lVar8 + lVar13 * 8) * *(double *)(lVar9 + lVar12 * 8) +
                   *(double *)(lVar10 + lVar12 * 8);
              lVar12 = lVar12 + 1;
            } while (lVar16 + (ulong)(lVar16 == 0) != lVar12);
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != lVar14 + (ulong)(lVar14 == 0));
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != lVar11 + (ulong)(lVar11 == 0));
  }
  return local_68;
}

Assistant:

std::vector<std::vector<T> > dot(std::vector<std::vector<T> > matrix1, std::vector<std::vector<T> > matrix2){
    std::vector<std::vector<T> > resultMatrix(matrix1.size(), std::vector<T>(matrix2[0].size(), 0));
    for(int i=0; i<matrix1.size(); i++){
        for(int j=0; j<matrix1[0].size(); j++){
            for(int k=0; k<matrix2[0].size(); k++){
                resultMatrix[i][k] += matrix1[i][j] * matrix2[j][k];
            }
        }
    }
    return resultMatrix;
}